

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

void StoreLevelStats(void)

{
  bool bVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  OneLevel *pOVar5;
  TFlags<ActorFlag,_unsigned_int> local_38;
  int local_34;
  AActor *pAStack_30;
  int mc;
  AActor *ac;
  TThinkerIterator<AActor> it;
  uint i;
  
  if ((gamestate == GS_LEVEL) && ((level.flags2 & 0x10000000) == 0)) {
    for (it.super_FThinkerIterator._20_4_ = 0; uVar2 = it.super_FThinkerIterator._20_4_,
        uVar3 = TArray<OneLevel,_OneLevel>::Size(&LevelData), (uint)uVar2 < uVar3;
        it.super_FThinkerIterator._20_4_ = it.super_FThinkerIterator._20_4_ + 1) {
      pOVar5 = TArray<OneLevel,_OneLevel>::operator[]
                         (&LevelData,(ulong)(uint)it.super_FThinkerIterator._20_4_);
      iVar4 = FString::CompareNoCase(&pOVar5->Levelname,&level.MapName);
      if (iVar4 == 0) break;
    }
    uVar2 = it.super_FThinkerIterator._20_4_;
    uVar3 = TArray<OneLevel,_OneLevel>::Size(&LevelData);
    if (uVar2 == uVar3) {
      TArray<OneLevel,_OneLevel>::Reserve(&LevelData,1);
      pOVar5 = TArray<OneLevel,_OneLevel>::operator[]
                         (&LevelData,(ulong)(uint)it.super_FThinkerIterator._20_4_);
      FString::operator=(&pOVar5->Levelname,&level.MapName);
    }
    iVar4 = level.total_monsters;
    pOVar5 = TArray<OneLevel,_OneLevel>::operator[]
                       (&LevelData,(ulong)(uint)it.super_FThinkerIterator._20_4_);
    pOVar5->totalkills = iVar4;
    iVar4 = level.killed_monsters;
    pOVar5 = TArray<OneLevel,_OneLevel>::operator[]
                       (&LevelData,(ulong)(uint)it.super_FThinkerIterator._20_4_);
    pOVar5->killcount = iVar4;
    iVar4 = level.total_secrets;
    pOVar5 = TArray<OneLevel,_OneLevel>::operator[]
                       (&LevelData,(ulong)(uint)it.super_FThinkerIterator._20_4_);
    pOVar5->totalsecrets = iVar4;
    iVar4 = level.found_secrets;
    pOVar5 = TArray<OneLevel,_OneLevel>::operator[]
                       (&LevelData,(ulong)(uint)it.super_FThinkerIterator._20_4_);
    pOVar5->secretcount = iVar4;
    iVar4 = AdjustTics(level.maptime);
    pOVar5 = TArray<OneLevel,_OneLevel>::operator[]
                       (&LevelData,(ulong)(uint)it.super_FThinkerIterator._20_4_);
    pOVar5->leveltime = iVar4;
    TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&ac,0x80);
    local_34 = 0;
    while (pAStack_30 = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&ac,false),
          pAStack_30 != (AActor *)0x0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_38,
                 (int)pAStack_30 +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_38);
      bVar1 = false;
      if (uVar3 != 0) {
        bVar1 = 0 < pAStack_30->health;
      }
      if (bVar1) {
        local_34 = local_34 + 1;
      }
    }
    if (local_34 == 0) {
      pOVar5 = TArray<OneLevel,_OneLevel>::operator[]
                         (&LevelData,(ulong)(uint)it.super_FThinkerIterator._20_4_);
      iVar4 = pOVar5->totalkills;
      pOVar5 = TArray<OneLevel,_OneLevel>::operator[]
                         (&LevelData,(ulong)(uint)it.super_FThinkerIterator._20_4_);
      pOVar5->killcount = iVar4;
    }
  }
  return;
}

Assistant:

static void StoreLevelStats()
{
	unsigned int i;

	if (gamestate != GS_LEVEL) return;

	if (!(level.flags2&LEVEL2_NOSTATISTICS))	// don't consider maps that were excluded from statistics
	{
		for(i=0;i<LevelData.Size();i++)
		{
			if (!LevelData[i].Levelname.CompareNoCase(level.MapName)) break;
		}
		if (i==LevelData.Size())
		{
			LevelData.Reserve(1);
			LevelData[i].Levelname = level.MapName;
		}
		LevelData[i].totalkills = level.total_monsters;
		LevelData[i].killcount = level.killed_monsters;
		LevelData[i].totalsecrets = level.total_secrets;
		LevelData[i].secretcount = level.found_secrets;
		LevelData[i].leveltime = AdjustTics(level.maptime);

		// Check for living monsters. On some maps it can happen
		// that the counter misses some. 
		TThinkerIterator<AActor> it;
		AActor *ac;
		int mc = 0;

		while ((ac = it.Next()))
		{
			if ((ac->flags & MF_COUNTKILL) && ac->health > 0) mc++;
		}
		if (mc == 0) LevelData[i].killcount = LevelData[i].totalkills;
	}
}